

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_in_parser.h
# Opt level: O3

bool parse::parse_column<float>(string *str,vector<float,_std::allocator<float>_> *vec)

{
  iterator __position;
  long lVar1;
  pointer str_00;
  long lVar2;
  bool bVar3;
  int num;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elements;
  float tmp;
  string arr_str;
  string num_str;
  int local_ac;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  string local_50;
  
  bVar3 = false;
  lVar1 = std::__cxx11::string::find((char *)str,0x12c260,0);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)str);
    parse_column(&local_50,&local_ac);
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar2 = 0;
    lVar1 = std::__cxx11::string::find((char)&local_70,0x2c);
    if (lVar1 != -1) {
      do {
        std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_70);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                   &local_90);
        if ((void *)CONCAT44(local_90._M_dataplus._M_p._4_4_,local_90._M_dataplus._M_p._0_4_) !=
            (void *)((long)&local_90 + 0x10U)) {
          operator_delete((void *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                           local_90._M_dataplus._M_p._0_4_));
        }
        lVar2 = lVar1 + 1;
        lVar1 = std::__cxx11::string::find((char)&local_70,0x2c);
      } while (lVar1 != -1);
    }
    if (lVar2 != local_68) {
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_70);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                 &local_90);
      if ((void *)CONCAT44(local_90._M_dataplus._M_p._4_4_,local_90._M_dataplus._M_p._0_4_) !=
          (void *)((long)&local_90 + 0x10U)) {
        operator_delete((void *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                         local_90._M_dataplus._M_p._0_4_));
      }
    }
    if (local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      str_00 = local_a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        parse_column(str_00,(float *)&local_90);
        __position._M_current =
             (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)vec,__position,(float *)&local_90);
        }
        else {
          *__position._M_current = local_90._M_dataplus._M_p._0_4_;
          (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
        str_00 = str_00 + 1;
      } while (str_00 != local_a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    bVar3 = (long)(vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2 == (long)local_ac;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return bVar3;
}

Assistant:

bool parse_column(const std::string& str, std::vector<T> *vec){
    bool ret = true;
    std::string::size_type pos = str.find(":");
    if (pos == std::string::npos){
        ret = false;
        return ret;
    }
    std::string num_str = str.substr(0, pos-0);
    std::string arr_str = str.substr(pos+1, str.length()-pos-1);
    int num;
    if (parse_column(num_str, &num) == -1){
        ret = false;
        return ret;
    };
    std::vector<std::string> elements;
    std::string::size_type start = 0;
    std::string::size_type end = arr_str.find(',');
    while (std::string::npos != end){
        elements.push_back(arr_str.substr(start, end - start));
        start = end + 1;
        end = arr_str.find(',', start);
    }
    if (start != arr_str.length()){
        elements.push_back(arr_str.substr(start));
    }
    for (std::vector<std::string>::const_iterator iter = elements.begin();
        iter != elements.end(); iter++){
        T tmp;
        parse_column(*iter, &tmp);
        vec->push_back(tmp);
    }
    if (num != vec->size()){
        ret = false;
        return ret;
    }
    return ret;
}